

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O1

JSValue js_os_seek(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  int64_t iVar1;
  int iVar2;
  ulong uVar3;
  int *piVar4;
  JSValueUnion JVar5;
  bool bVar6;
  JSValue JVar7;
  JSValue JVar8;
  int whence;
  int fd;
  int64_t pos;
  int local_30;
  int local_2c;
  __off_t local_28;
  
  iVar2 = JS_ToInt32(ctx,&local_2c,*argv);
  if (iVar2 == 0) {
    iVar1 = argv[1].tag;
    iVar2 = JS_ToInt64Ext(ctx,&local_28,argv[1]);
    if (iVar2 == 0) {
      iVar2 = JS_ToInt32(ctx,&local_30,argv[2]);
      if (iVar2 == 0) {
        uVar3 = lseek(local_2c,local_28,local_30);
        if (uVar3 == 0xffffffffffffffff) {
          piVar4 = __errno_location();
          uVar3 = -(long)*piVar4;
        }
        if ((int)iVar1 == -10) {
          JVar8 = JS_NewBigInt64(ctx,uVar3);
        }
        else {
          bVar6 = (long)(int)uVar3 == uVar3;
          JVar5.float64 = (double)(long)uVar3;
          if (bVar6) {
            JVar5.ptr = (void *)(uVar3 & 0xffffffff);
          }
          JVar8.tag = 7;
          JVar8.u.float64 = JVar5.float64;
          if (bVar6) {
            JVar8.tag = 0;
          }
        }
        uVar3 = (ulong)JVar8.u.ptr & 0xffffffff00000000;
        goto LAB_001139c4;
      }
    }
  }
  JVar8 = (JSValue)(ZEXT816(6) << 0x40);
  uVar3 = 0;
LAB_001139c4:
  JVar7.u.ptr = (void *)((ulong)JVar8.u.ptr & 0xffffffff | uVar3);
  JVar7.tag = JVar8.tag;
  return JVar7;
}

Assistant:

static JSValue js_os_seek(JSContext *ctx, JSValueConst this_val,
                          int argc, JSValueConst *argv)
{
    int fd, whence;
    int64_t pos, ret;
    BOOL is_bigint;
    
    if (JS_ToInt32(ctx, &fd, argv[0]))
        return JS_EXCEPTION;
    is_bigint = JS_IsBigInt(ctx, argv[1]);
    if (JS_ToInt64Ext(ctx, &pos, argv[1]))
        return JS_EXCEPTION;
    if (JS_ToInt32(ctx, &whence, argv[2]))
        return JS_EXCEPTION;
    ret = lseek(fd, pos, whence);
    if (ret == -1)
        ret = -errno;
    if (is_bigint)
        return JS_NewBigInt64(ctx, ret);
    else
        return JS_NewInt64(ctx, ret);
}